

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

hugeint_t __thiscall
duckdb::DeltaDecode<duckdb::hugeint_t>
          (duckdb *this,hugeint_t *data,hugeint_t previous_value,size_t size)

{
  hugeint_t *phVar1;
  ulong uVar2;
  int64_t extraout_RDX;
  int64_t iVar3;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  long lVar4;
  ulong uVar5;
  hugeint_t *phVar6;
  bool bVar7;
  hugeint_t hVar8;
  hugeint_t a;
  hugeint_t previous_value_local;
  
  uVar2 = previous_value.upper;
  previous_value_local.upper = previous_value.lower;
  previous_value_local.lower = (uint64_t)data;
  phVar1 = hugeint_t::operator+=((hugeint_t *)this,&previous_value_local);
  iVar3 = extraout_RDX;
  if (uVar2 < 4) {
    uVar5 = 1;
  }
  else {
    a.lower = *(uint64_t *)this;
    a.upper = *(int64_t *)(this + 8);
    phVar6 = (hugeint_t *)(this + 0x40);
    for (uVar5 = 1; uVar5 < (uVar2 & 0xfffffffffffffffc) - 4; uVar5 = uVar5 + 4) {
      phVar1 = hugeint_t::operator+=(phVar6 + -3,&a);
      a.lower = phVar1->lower;
      a.upper = phVar1->upper;
      phVar1 = hugeint_t::operator+=(phVar6 + -2,&a);
      a.lower = phVar1->lower;
      a.upper = phVar1->upper;
      phVar1 = hugeint_t::operator+=(phVar6 + -1,&a);
      a.lower = phVar1->lower;
      a.upper = phVar1->upper;
      phVar1 = hugeint_t::operator+=(phVar6,&a);
      a.lower = phVar1->lower;
      a.upper = phVar1->upper;
      phVar6 = phVar6 + 4;
      iVar3 = extraout_RDX_00;
    }
  }
  lVar4 = uVar2 - uVar5;
  phVar6 = (hugeint_t *)(this + uVar5 * 0x10);
  while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
    phVar1 = hugeint_t::operator+=(phVar6,phVar6 + -1);
    phVar6 = phVar6 + 1;
    iVar3 = extraout_RDX_01;
  }
  hVar8.upper = iVar3;
  hVar8.lower = (uint64_t)phVar1;
  return hVar8;
}

Assistant:

static T DeltaDecode(T *data, T previous_value, const size_t size) {
	D_ASSERT(size >= 1);

	data[0] += previous_value;

	const size_t UnrollQty = 4;
	const size_t sz0 = (size / UnrollQty) * UnrollQty; // equal to 0, if size < UnrollQty
	size_t i = 1;
	if (sz0 >= UnrollQty) {
		T a = data[0];
		for (; i < sz0 - UnrollQty; i += UnrollQty) {
			a = data[i] += a;
			a = data[i + 1] += a;
			a = data[i + 2] += a;
			a = data[i + 3] += a;
		}
	}
	for (; i != size; ++i) {
		data[i] += data[i - 1];
	}

	return data[size - 1];
}